

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

size_t encode_ber_length_integer(uint8_t *buf,size_t integer,int param_3)

{
  int local_20;
  int bytes_used;
  int param_2_local;
  size_t integer_local;
  uint8_t *buf_local;
  
  local_20 = 1;
  if (integer < 0x80) {
    *buf = (uint8_t)integer;
  }
  else {
    if (integer < 0x101) {
      integer_local = (size_t)(buf + 1);
      *buf = 0x81;
      local_20 = 2;
    }
    else {
      *buf = 0x82;
      integer_local = (size_t)(buf + 2);
      buf[1] = (uint8_t)(integer >> 8);
      local_20 = 3;
    }
    *(uint8_t *)integer_local = (uint8_t)integer;
  }
  return (long)local_20;
}

Assistant:

static size_t encode_ber_length_integer(uint8_t* buf, size_t integer, int){
    int bytes_used = 1;
    if(integer < 128){
        *buf = integer & 0xFF;
    } else {
        if(integer > 256){
            *buf++ = (2 | 0x80) & 0xFF;
            *buf++ = integer/256;
            bytes_used += 2;
        } else {
            *buf++ = (1 | 0x80) & 0xFF;
            bytes_used++;
        }
        *buf++ = integer%256;
    }
    return bytes_used;
}